

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderIntegerMixTests.cpp
# Opt level: O3

int __thiscall deqp::ShaderIntegerMixTests::init(ShaderIntegerMixTests *this,EVP_PKEY_CTX *ctx)

{
  GLSLVersion GVar1;
  Context *pCVar2;
  char *__s;
  int iVar3;
  TestNode *pTVar4;
  size_t sVar5;
  stringstream description;
  stringstream name;
  long local_3a0;
  long *local_388;
  long local_378 [2];
  char *local_368;
  long *local_360;
  long local_350 [2];
  stringstream local_340 [16];
  undefined1 local_330 [376];
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  pTVar4 = (TestNode *)operator_new(0x80);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar4,pCVar2->m_testCtx,"define",
             "Verify GL_EXT_shader_integer_mix is defined to 1.");
  pTVar4[1]._vptr_TestNode = (_func_int **)pCVar2;
  *(GLSLVersion *)&pTVar4[1].m_testCtx = GVar1;
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_0210b0f0;
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  pTVar4 = (TestNode *)operator_new(0x80);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar4,pCVar2->m_testCtx,"prototypes-extension",
             "Verify availability of all function signatures with the extension.");
  pTVar4[1]._vptr_TestNode = (_func_int **)pCVar2;
  *(GLSLVersion *)&pTVar4[1].m_testCtx = GVar1;
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_0210b180;
  *(undefined1 *)((long)&pTVar4[1].m_testCtx + 4) = 1;
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  pTVar4 = (TestNode *)operator_new(0x80);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar4,pCVar2->m_testCtx,"prototypes",
             "Verify availability of all function signatures with the proper GLSL version.");
  pTVar4[1]._vptr_TestNode = (_func_int **)pCVar2;
  *(GLSLVersion *)&pTVar4[1].m_testCtx = GVar1;
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_0210b180;
  *(undefined1 *)((long)&pTVar4[1].m_testCtx + 4) = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  local_3a0 = 0;
  do {
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"mix-",4);
    __s = *(char **)((long)init::types_to_test + local_3a0);
    sVar5 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar5);
    std::__cxx11::stringstream::stringstream(local_340);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_330,"Verify functionality of mix() with ",0x23);
    sVar5 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,__s,sVar5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330," parameters.",0xc);
    pTVar4 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::stringbuf::str();
    local_368 = __s;
    std::__cxx11::stringbuf::str();
    GVar1 = this->m_glslVersion;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar4,pCVar2->m_testCtx,(char *)local_388,(char *)local_360);
    pTVar4[1]._vptr_TestNode = (_func_int **)pCVar2;
    *(GLSLVersion *)&pTVar4[1].m_testCtx = GVar1;
    pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_0210b200;
    pTVar4[1].m_name._M_dataplus._M_p = local_368;
    tcu::TestNode::addChild((TestNode *)this,pTVar4);
    if (local_360 != local_350) {
      operator_delete(local_360,local_350[0] + 1);
    }
    if (local_388 != local_378) {
      operator_delete(local_388,local_378[0] + 1);
    }
    std::__cxx11::stringstream::~stringstream(local_340);
    std::ios_base::~ios_base((ios_base *)(local_330 + 0x70));
    std::__cxx11::stringstream::~stringstream(local_1b8);
    iVar3 = std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
    local_3a0 = local_3a0 + 8;
  } while (local_3a0 != 0x18);
  return iVar3;
}

Assistant:

void ShaderIntegerMixTests::init(void)
{
	addChild(new ShaderIntegerMixDefineCase(m_context, "define", "Verify GL_EXT_shader_integer_mix is defined to 1.",
											m_glslVersion));
	addChild(new ShaderIntegerMixPrototypesCase(m_context, "prototypes-extension",
												"Verify availability of all function signatures with the extension.",
												m_glslVersion, true));
	addChild(new ShaderIntegerMixPrototypesCase(
		m_context, "prototypes", "Verify availability of all function signatures with the proper GLSL version.",
		m_glslVersion, false));

	static const char* types_to_test[] = { "ivec4", "uvec4", "bvec4" };

	for (int i = 0; i < DE_LENGTH_OF_ARRAY(types_to_test); i++)
	{
		std::stringstream name;

		name << "mix-" << types_to_test[i];

		std::stringstream description;

		description << "Verify functionality of mix() with " << types_to_test[i] << " parameters.";

		addChild(new ShaderIntegerMixRenderCase(m_context, name.str().c_str(), description.str().c_str(), m_glslVersion,
												types_to_test[i]));
	}
}